

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int32_suite::fail_array8_int32_overflow(void)

{
  pointer buffer;
  size_type size;
  undefined4 local_54;
  size_type local_50;
  array<int,_1UL> local_44;
  undefined1 local_40 [4];
  array<int,_1UL> value;
  decoder decoder;
  value_type input [10];
  
  stack0xffffffffffffffee = 0x66554433221108ac;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[10]>
            ((decoder *)local_40,(uchar (*) [10])((long)&decoder.current.view._M_str + 6));
  memset(&local_44,0,4);
  buffer = std::array<int,_1UL>::data(&local_44);
  size = std::array<int,_1UL>::size(&local_44);
  local_50 = trial::protocol::bintoken::detail::decoder::array((decoder *)local_40,buffer,size);
  local_54 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x8c0,"void compact_int32_suite::fail_array8_int32_overflow()",&local_50,&local_54);
  return;
}

Assistant:

void fail_array8_int32_overflow()
{
    const value_type input[] = { token::code::array8_int32, 0x08, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    std::array<std::int32_t, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}